

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextSample
          (LA32WaveGenerator *this,Bit32u useAmp,Bit16u usePitch,Bit32u useCutoffVal)

{
  bool bVar1;
  Bit32u local_34;
  LogSample local_24;
  LogSample cosineLogSample;
  Bit32u useCutoffVal_local;
  Bit16u usePitch_local;
  Bit32u useAmp_local;
  LA32WaveGenerator *this_local;
  
  if ((this->active & 1U) != 0) {
    this->amp = useAmp;
    this->pitch = usePitch;
    cosineLogSample._0_4_ = useCutoffVal;
    cosineLogSample.sign._2_2_ = usePitch;
    bVar1 = isPCMWave(this);
    if (bVar1) {
      generateNextPCMWaveLogSamples(this);
    }
    else {
      if ((uint)cosineLogSample._0_4_ < 0x3c00001) {
        local_34 = cosineLogSample._0_4_;
      }
      else {
        local_34 = 0x3c00000;
      }
      this->cutoffVal = local_34;
      generateNextSquareWaveLogSample(this);
      generateNextResonanceWaveLogSample(this);
      if ((this->sawtoothWaveform & 1U) != 0) {
        generateNextSawtoothCosineLogSample(this,&local_24);
        LA32Utilites::addLogSamples(&this->squareLogSample,&local_24);
        LA32Utilites::addLogSamples(&this->resonanceLogSample,&local_24);
      }
      advancePosition(this);
    }
  }
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSample(const Bit32u useAmp, const Bit16u usePitch, const Bit32u useCutoffVal) {
	if (!active) {
		return;
	}

	amp = useAmp;
	pitch = usePitch;

	if (isPCMWave()) {
		generateNextPCMWaveLogSamples();
		return;
	}

	// The 240 cutoffVal limit was determined via sample analysis (internal Munt capture IDs: glop3, glop4).
	// More research is needed to be sure that this is correct, however.
	cutoffVal = (useCutoffVal > MAX_CUTOFF_VALUE) ? MAX_CUTOFF_VALUE : useCutoffVal;

	generateNextSquareWaveLogSample();
	generateNextResonanceWaveLogSample();
	if (sawtoothWaveform) {
		LogSample cosineLogSample;
		generateNextSawtoothCosineLogSample(cosineLogSample);
		LA32Utilites::addLogSamples(squareLogSample, cosineLogSample);
		LA32Utilites::addLogSamples(resonanceLogSample, cosineLogSample);
	}
	advancePosition();
}